

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wfc.cpp
# Opt level: O0

void __thiscall
WFC::WFC(WFC *this,bool periodic_output,int seed,
        vector<double,_std::allocator<double>_> *patterns_frequencies,PropagatorState *propagator,
        uint wave_height,uint wave_width)

{
  long lVar1;
  Propagator *this_00;
  size_type sVar2;
  undefined1 in_SIL;
  long in_RDI;
  vector<std::array<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_4UL>,_std::allocator<std::array<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_4UL>_>_>
  *in_R8;
  vector<double,_std::allocator<double>_> *in_stack_000000b0;
  uint in_stack_000000b8;
  uint in_stack_000000bc;
  Wave *in_stack_000000c0;
  result_type in_stack_ffffffffffffff78;
  linear_congruential_engine<unsigned_long,_48271UL,_0UL,_2147483647UL> *in_stack_ffffffffffffff80;
  undefined4 in_stack_ffffffffffffff88;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 in_stack_ffffffffffffff94;
  uint uVar5;
  vector<double,_std::allocator<double>_> *in_stack_ffffffffffffffc0;
  vector<double,_std::allocator<double>_> *in_stack_ffffffffffffffc8;
  vector<double,_std::allocator<double>_> *in_stack_ffffffffffffffd0;
  
  std::linear_congruential_engine<unsigned_long,_48271UL,_0UL,_2147483647UL>::
  linear_congruential_engine(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
  lVar1 = in_RDI + 8;
  this_00 = (Propagator *)anon_unknown.dwarf_1614b::normalize(in_stack_ffffffffffffffc0);
  std::vector<double,_std::allocator<double>_>::vector
            (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  Wave::Wave(in_stack_000000c0,in_stack_000000bc,in_stack_000000b8,in_stack_000000b0);
  sVar2 = std::
          vector<std::array<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_4UL>,_std::allocator<std::array<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_4UL>_>_>
          ::size(in_R8);
  *(size_type *)(in_RDI + 0x118) = sVar2;
  uVar3 = *(undefined4 *)(in_RDI + 0x108);
  uVar4 = *(undefined4 *)(in_RDI + 0x10c);
  uVar5 = CONCAT13(in_SIL,(int3)in_stack_ffffffffffffff94) & 0x1ffffff;
  std::
  vector<std::array<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_4UL>,_std::allocator<std::array<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_4UL>_>_>
  ::vector((vector<std::array<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_4UL>,_std::allocator<std::array<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_4UL>_>_>
            *)in_stack_ffffffffffffffd0,
           (vector<std::array<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_4UL>,_std::allocator<std::array<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_4UL>_>_>
            *)in_stack_ffffffffffffffc8);
  Propagator::Propagator
            (this_00,(uint)((ulong)lVar1 >> 0x20),(uint)lVar1,SUB41(uVar5 >> 0x18,0),
             (PropagatorState *)CONCAT44(uVar3,in_stack_ffffffffffffff88));
  std::
  vector<std::array<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_4UL>,_std::allocator<std::array<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_4UL>_>_>
  ::~vector((vector<std::array<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_4UL>,_std::allocator<std::array<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_4UL>_>_>
             *)CONCAT44(uVar5,uVar4));
  return;
}

Assistant:

WFC::WFC(bool periodic_output, int seed,
         std::vector<double> patterns_frequencies,
         Propagator::PropagatorState propagator, unsigned wave_height,
         unsigned wave_width)
  noexcept
  : gen(seed), patterns_frequencies(normalize(patterns_frequencies)),
    wave(wave_height, wave_width, patterns_frequencies),
    nb_patterns(propagator.size()),
    propagator(wave.height, wave.width, periodic_output, propagator) {}